

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::~ParamDict(ParamDict *this)

{
  undefined8 *puVar1;
  ParamDictPrivate *pPVar2;
  int *piVar3;
  void *__ptr;
  long *plVar4;
  long lVar5;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_00348e60;
  pPVar2 = this->d;
  if (pPVar2 != (ParamDictPrivate *)0x0) {
    lVar5 = 0x9b8;
    do {
      piVar3 = *(int **)((long)&pPVar2->params[0].v.data + lVar5);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          __ptr = *(void **)((long)&pPVar2->params[0].type + lVar5);
          plVar4 = *(long **)((long)&pPVar2->params[0].v.elempack + lVar5);
          if (plVar4 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      puVar1 = (undefined8 *)((long)&pPVar2->params[0].type + lVar5);
      *(undefined8 *)((long)&pPVar2->params[0].v.c + lVar5) = 0;
      *(undefined8 *)((long)puVar1 + 0xc) = 0;
      *(undefined8 *)((long)puVar1 + 0x14) = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pPVar2->params[0].v.allocator + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&pPVar2->params[0].v.h + lVar5) = 0;
      lVar5 = lVar5 + -0x50;
    } while (lVar5 != -0x48);
  }
  operator_delete(pPVar2,0xa00);
  return;
}

Assistant:

ParamDict::~ParamDict()
{
    delete d;
}